

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgconvert.cpp
# Opt level: O2

string * __thiscall Converter::header_abi_cxx11_(string *__return_storage_ptr__,Converter *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pointer puVar2;
  string *args_2;
  size_t i;
  size_type sVar3;
  pointer puVar4;
  string result;
  string guard;
  _Alloc_hider in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  args_2 = &this->_name;
  std::__cxx11::string::string((string *)&local_70,(string *)args_2);
  for (sVar3 = 0; local_70._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar1 = toupper((int)local_70._M_dataplus._M_p[sVar3]);
    local_70._M_dataplus._M_p[sVar3] = (char)iVar1;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff68,"__",&local_70);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff68,"_H__");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::~string((string *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  tinyformat::format<std::__cxx11::string>
            ((string *)&stack0xffffffffffffff68,(tinyformat *)"#ifndef %s\n",(char *)&local_50,
             in_RCX);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  tinyformat::format<std::__cxx11::string>
            ((string *)&stack0xffffffffffffff68,(tinyformat *)"#define %s\n",(char *)&local_50,
             in_RCX);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  tinyformat::format<std::__cxx11::string>
            ((string *)&stack0xffffffffffffff68,(tinyformat *)"static uint8_t %s_bitmap[] = {\n",
             (char *)args_2,in_RCX);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  for (puVar4 = (pointer)0x0;
      puVar2 = (this->_bitmap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
      puVar4 < (this->_bitmap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish + -(long)puVar2; puVar4 = puVar4 + 1) {
    if (((ulong)puVar4 & 0xf) == 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      puVar2 = (this->_bitmap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    tinyformat::format<unsigned_char>
              ((string *)&stack0xffffffffffffff68,"0x%02x",puVar4 + (long)puVar2);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    if (puVar4 == (this->_bitmap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish +
                  ~(ulong)(this->_bitmap).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start) break;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((int)((ulong)puVar4 & 0xf) == 0xf) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  tinyformat::format<>((string *)&stack0xffffffffffffff68,"\n};\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  tinyformat::format<std::__cxx11::string>
            ((string *)&stack0xffffffffffffff68,(tinyformat *)"static BitmapIcon %s = {\n",
             (char *)args_2,in_RCX);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  tinyformat::format<int,int,int,std::__cxx11::string>
            ((string *)&stack0xffffffffffffff68,(tinyformat *)"    %d, %d, %d, %s_bitmap\n",
             (char *)&this->_width,&this->_height,&this->_bpp,(int *)args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff68._M_p);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::operator+(&local_70,"#endif // ",&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff68,&local_70,"\n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string header() const {
        std::string guard = "__" + toUpperCase(_name) + "_H__";

        std::string result;
        result += tfm::format("#ifndef %s\n", guard);
        result += tfm::format("#define %s\n", guard);
        result += "\n";
        result += "#include \"BitmapIcon.h\"\n";
        result += "\n";

        result += tfm::format("static uint8_t %s_bitmap[] = {\n", _name);
        for (size_t i = 0; i < _bitmap.size(); ++i) {
            if (i % 16 == 0) {
                result += "    ";
            }
            result += tfm::format("0x%02x", _bitmap[i]);
            if (i == _bitmap.size() - 1) {
                break;
            }
            result += ", ";
            if (i % 16 == 15) {
                result += "\n";
            }
        }
        result += tfm::format("\n};\n");
        result += "\n";

        result += tfm::format("static BitmapIcon %s = {\n", _name);
        result += tfm::format("    %d, %d, %d, %s_bitmap\n", _width, _height, _bpp, _name);
        result += "};\n";

        result += "\n";
        result += "#endif // " + guard + "\n";

        return result;
    }